

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
::find_or_prepare_insert_non_soo<std::basic_string_view<char,std::char_traits<char>>>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
          *this,basic_string_view<char,_std::char_traits<char>_> *key)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  ushort uVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  char cVar38;
  undefined1 uVar39;
  bool bVar40;
  ushort uVar41;
  uint64_t uVar42;
  ctrl_t *pcVar43;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs;
  ulong uVar44;
  CommonFields *common;
  size_t sVar45;
  PolicyFunctions *in_R9;
  uint uVar46;
  ulong uVar47;
  undefined4 uVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  __m128i match;
  undefined1 auVar51 [16];
  FindInfo target;
  ulong local_90;
  basic_string_view<char,_std::char_traits<char>_> *local_68;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
  *local_60;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  char cStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  char cStack_49;
  undefined1 local_48 [16];
  
  uVar2 = key->_M_len;
  uVar42 = hash_internal::MixingHashState::CombineContiguousImpl
                     (&hash_internal::MixingHashState::kSeed,key->_M_str,uVar2);
  uVar3 = *(ulong *)this;
  if ((uVar3 + 1 & uVar3) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar44 = (uVar42 ^ uVar2) * -0x234dd359734ecb13;
  common = (CommonFields *)
           (uVar44 >> 0x38 | (uVar44 & 0xff000000000000) >> 0x28 | (uVar44 & 0xff0000000000) >> 0x18
            | (uVar44 & 0xff00000000) >> 8 | (uVar44 & 0xff000000) << 8 |
            (uVar44 & 0xff0000) << 0x18 | (uVar44 & 0xff00) << 0x28 | uVar44 << 0x38);
  uVar2 = *(ulong *)(this + 0x10);
  uVar47 = (ulong)common >> 7 ^ uVar2 >> 0xc;
  uVar39 = (undefined1)(uVar44 >> 0x38);
  auVar49 = ZEXT216(CONCAT11(uVar39,uVar39) & 0x7f7f);
  auVar49 = pshuflw(auVar49,auVar49,0);
  uVar48 = auVar49._0_4_;
  auVar49._4_4_ = uVar48;
  auVar49._0_4_ = uVar48;
  auVar49._8_4_ = uVar48;
  auVar49._12_4_ = uVar48;
  local_90 = 0;
  do {
    uVar47 = uVar47 & uVar3;
    pcVar1 = (char *)(uVar2 + uVar47);
    auVar50[0] = -(auVar49[0] == *pcVar1);
    auVar50[1] = -(auVar49[1] == pcVar1[1]);
    auVar50[2] = -(auVar49[2] == pcVar1[2]);
    auVar50[3] = -(auVar49[3] == pcVar1[3]);
    auVar50[4] = -(auVar49[4] == pcVar1[4]);
    auVar50[5] = -(auVar49[5] == pcVar1[5]);
    auVar50[6] = -(auVar49[6] == pcVar1[6]);
    auVar50[7] = -(auVar49[7] == pcVar1[7]);
    auVar50[8] = -(auVar49[8] == pcVar1[8]);
    auVar50[9] = -(auVar49[9] == pcVar1[9]);
    auVar50[10] = -(auVar49[10] == pcVar1[10]);
    auVar50[0xb] = -(auVar49[0xb] == pcVar1[0xb]);
    auVar50[0xc] = -(auVar49[0xc] == pcVar1[0xc]);
    auVar50[0xd] = -(auVar49[0xd] == pcVar1[0xd]);
    auVar50[0xe] = -(auVar49[0xe] == pcVar1[0xe]);
    auVar50[0xf] = -(auVar49[0xf] == pcVar1[0xf]);
    uVar41 = (ushort)(SUB161(auVar50 >> 7,0) & 1) | (ushort)(SUB161(auVar50 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar50 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar50 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar50 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar50 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar50 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar50 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar50 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar50 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar50 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar50 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar50 >> 0x77,0) & 1) << 0xe | (ushort)(auVar50[0xf] >> 7) << 0xf;
    uVar46 = (uint)uVar41;
    cVar23 = *pcVar1;
    cVar24 = pcVar1[1];
    cVar25 = pcVar1[2];
    cVar26 = pcVar1[3];
    cVar27 = pcVar1[4];
    cVar28 = pcVar1[5];
    cVar29 = pcVar1[6];
    cVar30 = pcVar1[7];
    cVar31 = pcVar1[8];
    cVar32 = pcVar1[9];
    cVar33 = pcVar1[10];
    cVar34 = pcVar1[0xb];
    cVar35 = pcVar1[0xc];
    cVar36 = pcVar1[0xd];
    cVar37 = pcVar1[0xe];
    cVar38 = pcVar1[0xf];
    cVar7 = local_58;
    cVar8 = cStack_57;
    cVar9 = cStack_56;
    cVar10 = cStack_55;
    cVar11 = cStack_54;
    cVar12 = cStack_53;
    cVar13 = cStack_52;
    cVar14 = cStack_51;
    cVar15 = cStack_50;
    cVar16 = cStack_4f;
    cVar17 = cStack_4e;
    cVar18 = cStack_4d;
    cVar19 = cStack_4c;
    cVar20 = cStack_4b;
    cVar21 = cStack_4a;
    cVar22 = cStack_49;
    while (cStack_49 = cVar38, cStack_4a = cVar37, cStack_4b = cVar36, cStack_4c = cVar35,
          cStack_4d = cVar34, cStack_4e = cVar33, cStack_4f = cVar32, cStack_50 = cVar31,
          cStack_51 = cVar30, cStack_52 = cVar29, cStack_53 = cVar28, cStack_54 = cVar27,
          cStack_55 = cVar26, cStack_56 = cVar25, cStack_57 = cVar24, local_58 = cVar23, uVar41 != 0
          ) {
      uVar5 = 0;
      if (uVar46 != 0) {
        for (; (uVar46 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      sVar45 = uVar5 + uVar47 & uVar3;
      lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (sVar45 * 0x20 + *(long *)(this + 0x18));
      local_68 = key;
      local_60 = this;
      local_48 = auVar49;
      bVar40 = EqualElement<std::basic_string_view<char,std::char_traits<char>>>::operator()
                         (&local_68,lhs,lhs);
      if (bVar40) {
        if (*(long *)(this + 0x10) == 0) goto LAB_00e14750;
        pcVar43 = (ctrl_t *)(*(long *)(this + 0x10) + sVar45);
        bVar40 = false;
        goto LAB_00e1470a;
      }
      uVar41 = (ushort)(uVar46 - 1) & (ushort)uVar46;
      uVar46 = CONCAT22((short)(uVar46 - 1 >> 0x10),uVar41);
      auVar49 = local_48;
      cVar23 = local_58;
      cVar24 = cStack_57;
      cVar25 = cStack_56;
      cVar26 = cStack_55;
      cVar27 = cStack_54;
      cVar28 = cStack_53;
      cVar29 = cStack_52;
      cVar30 = cStack_51;
      cVar31 = cStack_50;
      cVar32 = cStack_4f;
      cVar33 = cStack_4e;
      cVar34 = cStack_4d;
      cVar35 = cStack_4c;
      cVar36 = cStack_4b;
      cVar37 = cStack_4a;
      cVar38 = cStack_49;
      cVar7 = local_58;
      cVar8 = cStack_57;
      cVar9 = cStack_56;
      cVar10 = cStack_55;
      cVar11 = cStack_54;
      cVar12 = cStack_53;
      cVar13 = cStack_52;
      cVar14 = cStack_51;
      cVar15 = cStack_50;
      cVar16 = cStack_4f;
      cVar17 = cStack_4e;
      cVar18 = cStack_4d;
      cVar19 = cStack_4c;
      cVar20 = cStack_4b;
      cVar21 = cStack_4a;
      cVar22 = cStack_49;
    }
    auVar51[0] = -(local_58 == -0x80);
    auVar51[1] = -(cStack_57 == -0x80);
    auVar51[2] = -(cStack_56 == -0x80);
    auVar51[3] = -(cStack_55 == -0x80);
    auVar51[4] = -(cStack_54 == -0x80);
    auVar51[5] = -(cStack_53 == -0x80);
    auVar51[6] = -(cStack_52 == -0x80);
    auVar51[7] = -(cStack_51 == -0x80);
    auVar51[8] = -(cStack_50 == -0x80);
    auVar51[9] = -(cStack_4f == -0x80);
    auVar51[10] = -(cStack_4e == -0x80);
    auVar51[0xb] = -(cStack_4d == -0x80);
    auVar51[0xc] = -(cStack_4c == -0x80);
    auVar51[0xd] = -(cStack_4b == -0x80);
    auVar51[0xe] = -(cStack_4a == -0x80);
    auVar51[0xf] = -(cStack_49 == -0x80);
    uVar41 = (ushort)(SUB161(auVar51 >> 7,0) & 1) | (ushort)(SUB161(auVar51 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar51 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar51 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar51 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar51 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar51 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar51 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar51 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar51 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar51 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar51 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar51 >> 0x77,0) & 1) << 0xe | (ushort)(auVar51[0xf] >> 7) << 0xf;
    local_58 = cVar7;
    cStack_57 = cVar8;
    cStack_56 = cVar9;
    cStack_55 = cVar10;
    cStack_54 = cVar11;
    cStack_53 = cVar12;
    cStack_52 = cVar13;
    cStack_51 = cVar14;
    cStack_50 = cVar15;
    cStack_4f = cVar16;
    cStack_4e = cVar17;
    cStack_4d = cVar18;
    cStack_4c = cVar19;
    cStack_4b = cVar20;
    cStack_4a = cVar21;
    cStack_49 = cVar22;
    if (uVar41 != 0) {
      bVar40 = ShouldInsertBackwardsForDebug
                         (*(size_t *)this,(size_t)common,*(ctrl_t **)(this + 0x10));
      if (bVar40) {
        uVar6 = 0xf;
        if (uVar41 != 0) {
          for (; uVar41 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        uVar46 = (ushort)((uVar6 ^ 0xfff0) + 0x11) - 1;
      }
      else {
        uVar46 = 0;
        if (uVar41 != 0) {
          for (; (uVar41 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
          }
        }
      }
      target.probe_length = (size_t)GetPolicyFunctions()::value;
      target.offset = local_90;
      sVar45 = PrepareInsertNonSoo((container_internal *)this,common,uVar46 + uVar47 & uVar3,target,
                                   in_R9);
      if (*(long *)(this + 0x10) == 0) {
LAB_00e14750:
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9ef,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::basic_string<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::basic_string<char>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashSetPolicy<std::basic_string<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::basic_string<char>>]"
                     );
      }
      pcVar43 = (ctrl_t *)(*(long *)(this + 0x10) + sVar45);
      bVar40 = true;
LAB_00e1470a:
      lVar4 = *(long *)(this + 0x18);
      (__return_storage_ptr__->first).ctrl_ = pcVar43;
      (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(sVar45 * 0x20 + lVar4);
      __return_storage_ptr__->second = bVar40;
      return __return_storage_ptr__;
    }
    uVar47 = uVar47 + local_90 + 0x10;
    local_90 = local_90 + 0x10;
    if (*(ulong *)this < local_90) {
      __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xf7d,
                    "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::basic_string<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::basic_string<char>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<std::basic_string<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::basic_string<char>>, K = std::basic_string_view<char>]"
                   );
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      ABSL_SWISSTABLE_ASSERT(seq.index() <= capacity() && "full table!");
    }
  }